

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureFilterMinmaxUtils::SupportedTextureType::SupportedTextureType
          (SupportedTextureType *this,GLenum type,string *shaderTexcoordType,
          string *shaderSamplerType)

{
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_59;
  string local_58;
  string *local_28;
  string *shaderSamplerType_local;
  string *shaderTexcoordType_local;
  SupportedTextureType *pSStack_10;
  GLenum type_local;
  SupportedTextureType *this_local;
  
  this->_vptr_SupportedTextureType = (_func_int **)&PTR___cxa_pure_virtual_0323b1f8;
  this->m_type = type;
  local_28 = shaderSamplerType;
  shaderSamplerType_local = shaderTexcoordType;
  shaderTexcoordType_local._4_4_ = type;
  pSStack_10 = this;
  tcu::Vector<int,_3>::Vector(&this->m_size);
  std::__cxx11::string::string((string *)&this->m_vertexShader);
  std::__cxx11::string::string((string *)&this->m_fragmentShader);
  std::__cxx11::string::operator=
            ((string *)&this->m_vertexShader,
             "#version 450 core\nin highp vec2 position;\nin <texcoord_type> inTexcoord;\nout <texcoord_type> texcoord;\nvoid main()\n{\n\ttexcoord = inTexcoord;\n\tgl_Position = vec4(position, 0.0, 1.0);\n}\n"
            );
  std::__cxx11::string::operator=
            ((string *)&this->m_fragmentShader,
             "#version 450 core\nuniform <sampler_type> sampler;\nin <texcoord_type> texcoord;\nout vec4 color;\nvoid main()\n{\n\tcolor = texture(sampler, texcoord);\n}\n"
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"<texcoord_type>",&local_59);
  replaceAll(this,&this->m_vertexShader,&local_58,shaderSamplerType_local);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"<texcoord_type>",&local_81);
  replaceAll(this,&this->m_fragmentShader,&local_80,shaderSamplerType_local);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"<sampler_type>",&local_a9)
  ;
  replaceAll(this,&this->m_fragmentShader,&local_a8,local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  return;
}

Assistant:

TextureFilterMinmaxUtils::SupportedTextureType::SupportedTextureType(glw::GLenum		type,
																	 const std::string& shaderTexcoordType,
																	 const std::string& shaderSamplerType)
	: m_type(type)
{
	m_vertexShader = "#version 450 core\n"
					 "in highp vec2 position;\n"
					 "in <texcoord_type> inTexcoord;\n"
					 "out <texcoord_type> texcoord;\n"
					 "void main()\n"
					 "{\n"
					 "	texcoord = inTexcoord;\n"
					 "	gl_Position = vec4(position, 0.0, 1.0);\n"
					 "}\n";

	m_fragmentShader = "#version 450 core\n"
					   "uniform <sampler_type> sampler;\n"
					   "in <texcoord_type> texcoord;\n"
					   "out vec4 color;\n"
					   "void main()\n"
					   "{\n"
					   "	color = texture(sampler, texcoord);\n"
					   "}\n";

	replaceAll(m_vertexShader, "<texcoord_type>", shaderTexcoordType);
	replaceAll(m_fragmentShader, "<texcoord_type>", shaderTexcoordType);
	replaceAll(m_fragmentShader, "<sampler_type>", shaderSamplerType);
}